

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WindowUpdate(Parse *pParse,Window *pList,Window *pWin,FuncDef *pFunc)

{
  Window *pWVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  int local_fc;
  int i;
  WindowUpdate aUp [8];
  sqlite3 *db;
  Window *p;
  FuncDef *pFunc_local;
  Window *pWin_local;
  Window *pList_local;
  Parse *pParse_local;
  
  if ((pWin->zName == (char *)0x0) || (pWin->eFrmType != '\0')) {
    sqlite3WindowChain(pParse,pWin,pList);
  }
  else {
    pWVar1 = windowFind(pParse,pList,pWin->zName);
    if (pWVar1 == (Window *)0x0) {
      return;
    }
    pEVar2 = sqlite3ExprListDup(pParse->db,pWVar1->pPartition,0);
    pWin->pPartition = pEVar2;
    pEVar2 = sqlite3ExprListDup(pParse->db,pWVar1->pOrderBy,0);
    pWin->pOrderBy = pEVar2;
    pEVar3 = sqlite3ExprDup(pParse->db,pWVar1->pStart,0);
    pWin->pStart = pEVar3;
    pEVar3 = sqlite3ExprDup(pParse->db,pWVar1->pEnd,0);
    pWin->pEnd = pEVar3;
    pWin->eStart = pWVar1->eStart;
    pWin->eEnd = pWVar1->eEnd;
    pWin->eFrmType = pWVar1->eFrmType;
    pWin->eExclude = pWVar1->eExclude;
  }
  if (((pWin->eFrmType == 'V') && ((pWin->pStart != (Expr *)0x0 || (pWin->pEnd != (Expr *)0x0)))) &&
     ((pWin->pOrderBy == (ExprList *)0x0 || (pWin->pOrderBy->nExpr != 1)))) {
    sqlite3ErrorMsg(pParse,"RANGE with offset PRECEDING/FOLLOWING requires one ORDER BY expression")
    ;
  }
  else if ((pFunc->funcFlags & 0x10000) != 0) {
    aUp[7]._16_8_ = pParse->db;
    if (pWin->pFilter == (Expr *)0x0) {
      memcpy(&stack0xffffffffffffff08,&PTR_row_numberName_00290c30,0xc0);
      for (local_fc = 0; local_fc < 8; local_fc = local_fc + 1) {
        if (pFunc->zName == *(char **)&aUp[(long)local_fc + -1].eEnd) {
          sqlite3ExprDelete((sqlite3 *)aUp[7]._16_8_,pWin->pStart);
          sqlite3ExprDelete((sqlite3 *)aUp[7]._16_8_,pWin->pEnd);
          pWin->pStart = (Expr *)0x0;
          pWin->pEnd = (Expr *)0x0;
          pWin->eFrmType = (u8)*(undefined4 *)&aUp[local_fc].zFunc;
          pWin->eStart = (u8)*(undefined4 *)((long)&aUp[local_fc].zFunc + 4);
          pWin->eEnd = (u8)aUp[local_fc].eFrmType;
          pWin->eExclude = '\0';
          if (pWin->eStart == 'S') {
            pEVar3 = sqlite3Expr((sqlite3 *)aUp[7]._16_8_,0x93,"1");
            pWin->pStart = pEVar3;
          }
          break;
        }
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"FILTER clause may only be used with aggregate window functions");
    }
  }
  pWin->pFunc = pFunc;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowUpdate(
  Parse *pParse, 
  Window *pList,                  /* List of named windows for this SELECT */
  Window *pWin,                   /* Window frame to update */
  FuncDef *pFunc                  /* Window function definition */
){
  if( pWin->zName && pWin->eFrmType==0 ){
    Window *p = windowFind(pParse, pList, pWin->zName);
    if( p==0 ) return;
    pWin->pPartition = sqlite3ExprListDup(pParse->db, p->pPartition, 0);
    pWin->pOrderBy = sqlite3ExprListDup(pParse->db, p->pOrderBy, 0);
    pWin->pStart = sqlite3ExprDup(pParse->db, p->pStart, 0);
    pWin->pEnd = sqlite3ExprDup(pParse->db, p->pEnd, 0);
    pWin->eStart = p->eStart;
    pWin->eEnd = p->eEnd;
    pWin->eFrmType = p->eFrmType;
    pWin->eExclude = p->eExclude;
  }else{
    sqlite3WindowChain(pParse, pWin, pList);
  }
  if( (pWin->eFrmType==TK_RANGE)
   && (pWin->pStart || pWin->pEnd) 
   && (pWin->pOrderBy==0 || pWin->pOrderBy->nExpr!=1)
  ){
    sqlite3ErrorMsg(pParse, 
      "RANGE with offset PRECEDING/FOLLOWING requires one ORDER BY expression"
    );
  }else
  if( pFunc->funcFlags & SQLITE_FUNC_WINDOW ){
    sqlite3 *db = pParse->db;
    if( pWin->pFilter ){
      sqlite3ErrorMsg(pParse, 
          "FILTER clause may only be used with aggregate window functions"
      );
    }else{
      struct WindowUpdate {
        const char *zFunc;
        int eFrmType;
        int eStart;
        int eEnd;
      } aUp[] = {
        { row_numberName,   TK_ROWS,   TK_UNBOUNDED, TK_CURRENT }, 
        { dense_rankName,   TK_RANGE,  TK_UNBOUNDED, TK_CURRENT }, 
        { rankName,         TK_RANGE,  TK_UNBOUNDED, TK_CURRENT }, 
        { percent_rankName, TK_GROUPS, TK_CURRENT,   TK_UNBOUNDED }, 
        { cume_distName,    TK_GROUPS, TK_FOLLOWING, TK_UNBOUNDED }, 
        { ntileName,        TK_ROWS,   TK_CURRENT,   TK_UNBOUNDED }, 
        { leadName,         TK_ROWS,   TK_UNBOUNDED, TK_UNBOUNDED }, 
        { lagName,          TK_ROWS,   TK_UNBOUNDED, TK_CURRENT }, 
      };
      int i;
      for(i=0; i<ArraySize(aUp); i++){
        if( pFunc->zName==aUp[i].zFunc ){
          sqlite3ExprDelete(db, pWin->pStart);
          sqlite3ExprDelete(db, pWin->pEnd);
          pWin->pEnd = pWin->pStart = 0;
          pWin->eFrmType = aUp[i].eFrmType;
          pWin->eStart = aUp[i].eStart;
          pWin->eEnd = aUp[i].eEnd;
          pWin->eExclude = 0;
          if( pWin->eStart==TK_FOLLOWING ){
            pWin->pStart = sqlite3Expr(db, TK_INTEGER, "1");
          }
          break;
        }
      }
    }
  }
  pWin->pFunc = pFunc;
}